

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

KUINT8 __thiscall KDIS::PDU::Minefield_Data_PDU::calcPaddingPaintScheme(Minefield_Data_PDU *this)

{
  MinefieldDataFilter *this_00;
  KBOOL KVar1;
  KBOOL KVar2;
  KUINT8 KVar3;
  
  this_00 = &this->m_DataFilter;
  KVar1 = DATA_TYPE::MinefieldDataFilter::IsFusing(this_00);
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(this_00);
  KVar3 = '\0';
  if (KVar2) {
    KVar3 = this->m_ui8NumSensTyp;
  }
  KVar2 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(this_00);
  return ((~KVar1 * '\x02' - KVar3) - KVar2) * this->m_ui8NumMines & 3;
}

Assistant:

KUINT8 Minefield_Data_PDU::calcPaddingPaintScheme() const
{
    // Padding � 8{[4 � N(2 F(8) + M F(9) + F(10) + 2)] mod4} bits unused
    KUINT8 ui8NeedPadding = 2, ui8Pad = 0;
    if( m_DataFilter.IsFusing() )                       ui8NeedPadding += 2;
    if( m_DataFilter.IsScalarDetectionCoefficient() )   ui8NeedPadding += m_ui8NumSensTyp;
    if( m_DataFilter.IsPaintScheme() )                  ++ui8NeedPadding;
    ui8NeedPadding = 4 - ( m_ui8NumMines * ui8NeedPadding );
    return ui8NeedPadding % 4;
}